

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

void __thiscall arangodb::velocypack::Builder::addInt(Builder *this,int64_t v)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  byte bVar3;
  
  if ((ulong)v < 10) {
    bVar3 = (byte)v | 0x30;
  }
  else {
    if ((ulong)v < 0xfffffffffffffffa) {
      appendInt(this,v,'\x1f');
      return;
    }
    bVar3 = (byte)v + 0x40;
  }
  reserve(this,1);
  VVar2 = this->_pos;
  this->_pos = VVar2 + 1;
  this->_start[VVar2] = bVar3;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + 1;
  return;
}

Assistant:

void addInt(int64_t v) {
    if (v >= 0 && v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else if (v < 0 && v >= -6) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x40 + v));
    } else {
      // regular int
      appendInt(v, 0x1f);
    }
  }